

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugTools.h
# Opt level: O3

bool cm::anon_unknown_0::dbg_impl<bool>(char *fname,int line,char *expr,bool value)

{
  char cVar1;
  ostream *poVar2;
  size_t sVar3;
  undefined4 in_register_00000034;
  char *__s;
  string local_70;
  undefined1 local_50 [32];
  char local_30;
  
  __s = (char *)CONCAT44(in_register_00000034,line);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CMAKE_NO_DBG","");
  cmSystemTools::GetEnvVar
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&((_Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                   *)local_50)->_M_value,&local_70);
  cVar1 = local_30;
  if (local_30 == '\x01') {
    local_30 = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_50._1_7_,local_50[0]) !=
        &(((_Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
            *)local_50)->_M_value).field_2) {
      operator_delete((undefined1 *)CONCAT71(local_50._1_7_,local_50[0]),local_50._16_8_ + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Tests/CMakeLib/testDebug.cxx"
               ,100);
    local_50[0] = 0x3a;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_50,1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)fname);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
    if (__s == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)poVar2->_vptr_basic_ostream[-3]);
    }
    else {
      sVar3 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ",3);
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  return (bool)(char)expr;
}

Assistant:

T dbg_impl(const char* fname, int line, const char* expr, T value)
{
  if (!cmSystemTools::GetEnvVar("CMAKE_NO_DBG")) {
    std::cerr << fname << ':' << line << ": " << expr << " = " << value
              << std::endl;
  }
  return value;
}